

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_end_utt(acmod_t *acmod)

{
  int32 iVar1;
  uint uVar2;
  int iVar3;
  ulong in_RAX;
  long lVar4;
  ulong uVar5;
  int32 nfr;
  undefined8 local_18;
  
  local_18 = in_RAX & 0xffffffff00000000;
  acmod->state = '\x03';
  if (acmod->n_mfc_frame < acmod->n_mfc_alloc) {
    fe_end_utt(acmod->fe,
               acmod->mfc_buf[(acmod->n_mfc_frame + acmod->mfc_outidx) % acmod->n_mfc_alloc],
               (int32 *)&local_18);
    acmod->n_mfc_frame = acmod->n_mfc_frame + (int)local_18;
    if ((int)local_18 != 0) {
      iVar1 = acmod_process_mfcbuf(acmod);
      local_18 = CONCAT44(local_18._4_4_,iVar1);
      goto LAB_0011b0e3;
    }
  }
  feat_update_stats(acmod->fcb);
LAB_0011b0e3:
  if ((FILE *)acmod->mfcfh != (FILE *)0x0) {
    lVar4 = ftell((FILE *)acmod->mfcfh);
    uVar5 = lVar4 - 1;
    if (-1 < (long)(lVar4 - 4U)) {
      uVar5 = lVar4 - 4U;
    }
    uVar2 = (uint)(uVar5 >> 2);
    local_18 = CONCAT44(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18,(int)local_18);
    iVar3 = fseek((FILE *)acmod->mfcfh,0,0);
    if (iVar3 == 0) {
      fwrite((void *)((long)&local_18 + 4),4,1,(FILE *)acmod->mfcfh);
    }
    fclose((FILE *)acmod->mfcfh);
    acmod->mfcfh = (FILE *)0x0;
  }
  if ((FILE *)acmod->rawfh != (FILE *)0x0) {
    fclose((FILE *)acmod->rawfh);
    acmod->rawfh = (FILE *)0x0;
  }
  if ((FILE *)acmod->senfh != (FILE *)0x0) {
    fclose((FILE *)acmod->senfh);
    acmod->senfh = (FILE *)0x0;
  }
  return (int)local_18;
}

Assistant:

int
acmod_end_utt(acmod_t *acmod)
{
    int32 nfr = 0;

    acmod->state = ACMOD_ENDED;
    if (acmod->n_mfc_frame < acmod->n_mfc_alloc) {
        int inptr;
        /* Where to start writing them (circular buffer) */
        inptr = (acmod->mfc_outidx + acmod->n_mfc_frame) % acmod->n_mfc_alloc;
        /* nfr is always either zero or one. */
        fe_end_utt(acmod->fe, acmod->mfc_buf[inptr], &nfr);
        acmod->n_mfc_frame += nfr;
        /* Process whatever's left, and any leadout. */
        if (nfr)
            nfr = acmod_process_mfcbuf(acmod);
        else /* Make sure to update CMN! */
            feat_update_stats(acmod->fcb);
    }
    else /* Make sure to update CMN! */
        feat_update_stats(acmod->fcb);
    if (acmod->mfcfh) {
        int32 outlen, rv;
        outlen = (ftell(acmod->mfcfh) - 4) / 4;
        SWAP_BE_32(&outlen);
        /* Try to seek and write */
        if ((rv = fseek(acmod->mfcfh, 0, SEEK_SET)) == 0) {
            fwrite(&outlen, 4, 1, acmod->mfcfh);
        }
        fclose(acmod->mfcfh);
        acmod->mfcfh = NULL;
    }
    if (acmod->rawfh) {
        fclose(acmod->rawfh);
        acmod->rawfh = NULL;
    }

    if (acmod->senfh) {
        fclose(acmod->senfh);
        acmod->senfh = NULL;
    }

    return nfr;
}